

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O1

NextTask * __thiscall
dd::TaskQueueStdlib::GetNextTask(NextTask *__return_storage_ptr__,TaskQueueStdlib *this)

{
  unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *puVar1;
  const_iterator __position;
  long lVar2;
  _Base_ptr p_Var3;
  _Map_pointer pppVar4;
  _Elt_pointer ppVar5;
  QueuedTask *pQVar6;
  QueuedTask *pQVar7;
  long lVar8;
  
  __return_storage_ptr__->_final_task = false;
  (__return_storage_ptr__->_run_task)._M_t.
  super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
  super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
  super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl = (QueuedTask *)0x0;
  __return_storage_ptr__->_sleep_time_ms = 0;
  lVar8 = std::chrono::_V2::system_clock::now();
  pthread_mutex_lock((pthread_mutex_t *)&this->_pending_lock);
  if (this->_thread_should_quit == true) {
    __return_storage_ptr__->_final_task = true;
  }
  else {
    puVar1 = &__return_storage_ptr__->_run_task;
    if ((this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      lVar8 = lVar8 / 1000000;
      __position._M_node =
           (this->_delayed_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      lVar2 = *(long *)(__position._M_node + 1);
      if (lVar2 - lVar8 == 0 || lVar2 < lVar8) {
        pppVar4 = (this->_pending_queue).c.
                  super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
        ppVar5 = (this->_pending_queue).c.
                 super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        if ((((long)(this->_pending_queue).c.
                    super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar5 >> 4) +
             ((long)(this->_pending_queue).c.
                    super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(this->_pending_queue).c.
                    super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)pppVar4 -
                       (long)(this->_pending_queue).c.
                             super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(pppVar4 == (_Map_pointer)0x0)) * 0x20 == 0) ||
           (__position._M_node[1]._M_parent <= (_Base_ptr)ppVar5->first)) {
          p_Var3 = __position._M_node[1]._M_left;
          __position._M_node[1]._M_left = (_Base_ptr)0x0;
          (puVar1->_M_t).super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>
          ._M_t.super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
          super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl = (QueuedTask *)p_Var3;
          std::
          _Rb_tree<dd::TaskQueueStdlib::DelayedEntryTimeout,_std::pair<const_dd::TaskQueueStdlib::DelayedEntryTimeout,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::_Select1st<std::pair<const_dd::TaskQueueStdlib::DelayedEntryTimeout,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>,_std::less<dd::TaskQueueStdlib::DelayedEntryTimeout>,_std::allocator<std::pair<const_dd::TaskQueueStdlib::DelayedEntryTimeout,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
          ::_M_erase_aux(&(this->_delayed_queue)._M_t,__position);
        }
        else {
          pQVar6 = (ppVar5->second)._M_t.
                   super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
                   super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
                   super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl;
          (ppVar5->second)._M_t.
          super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
          super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
          super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl = (QueuedTask *)0x0;
          (puVar1->_M_t).super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>
          ._M_t.super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
          super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl = pQVar6;
          std::
          deque<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
          ::pop_front(&(this->_pending_queue).c);
        }
      }
      else {
        __return_storage_ptr__->_sleep_time_ms = lVar2 - lVar8;
      }
      if (lVar2 <= lVar8) goto LAB_001243f1;
    }
    pppVar4 = (this->_pending_queue).c.
              super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar5 = (this->_pending_queue).c.
             super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (((long)(this->_pending_queue).c.
               super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar5 >> 4) +
        ((long)(this->_pending_queue).c.
               super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)(this->_pending_queue).c.
               super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
        ((((ulong)((long)pppVar4 -
                  (long)(this->_pending_queue).c.
                        super__Deque_base<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(pppVar4 == (_Map_pointer)0x0)) * 0x20 != 0) {
      pQVar6 = (ppVar5->second)._M_t.
               super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
               super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
               super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl;
      (ppVar5->second)._M_t.
      super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
      super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
      super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl = (QueuedTask *)0x0;
      pQVar7 = (puVar1->_M_t).
               super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
               super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
               super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl;
      (puVar1->_M_t).super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>.
      _M_t.super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
      super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl = pQVar6;
      if (pQVar7 != (QueuedTask *)0x0) {
        (*pQVar7->_vptr_QueuedTask[1])();
      }
      std::
      deque<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>,_std::allocator<std::pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
      ::pop_front(&(this->_pending_queue).c);
    }
  }
LAB_001243f1:
  pthread_mutex_unlock((pthread_mutex_t *)&this->_pending_lock);
  return __return_storage_ptr__;
}

Assistant:

dd::TaskQueueStdlib::NextTask TaskQueueStdlib::GetNextTask()
	{
		NextTask result{};
		auto tick = GetCurrentTick();
		AutoLock lock(_pending_lock);
		if (_thread_should_quit) {
			result._final_task = true;
			return result;
		}

		if (_delayed_queue.size() > 0) {
			auto delayed_entry = _delayed_queue.begin();
			const auto& delay_info = delayed_entry->first;
			auto& delay_run = delayed_entry->second;
			if (tick >= delay_info._next_fire_at_ms) {
				if (_pending_queue.size() > 0) {
					auto& entry = _pending_queue.front();
					auto& entry_order = entry.first;
					auto& entry_run = entry.second;
					if (entry_order < delay_info._order){
						result._run_task = std::move(entry_run);
						_pending_queue.pop();
						return result;
					}
				}

				result._run_task = std::move(delay_run);
				_delayed_queue.erase(delayed_entry);
				return result;
			}
			result._sleep_time_ms = delay_info._next_fire_at_ms - tick;
		}

		if (_pending_queue.size() > 0) {
			auto& entry = _pending_queue.front();
			result._run_task = std::move(entry.second);
			_pending_queue.pop();
		}
		return result;
	}